

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

bool __thiscall tinygltf::Material::operator==(Material *this,Material *other)

{
  size_t __n;
  bool bVar1;
  __type _Var2;
  int iVar3;
  
  bVar1 = PbrMetallicRoughness::operator==(&this->pbrMetallicRoughness,&other->pbrMetallicRoughness)
  ;
  if (((((bVar1) &&
        (bVar1 = NormalTextureInfo::operator==(&this->normalTexture,&other->normalTexture), bVar1))
       && (bVar1 = OcclusionTextureInfo::operator==
                             (&this->occlusionTexture,&other->occlusionTexture), bVar1)) &&
      ((bVar1 = TextureInfo::operator==(&this->emissiveTexture,&other->emissiveTexture), bVar1 &&
       (bVar1 = Equals(&this->emissiveFactor,&other->emissiveFactor), bVar1)))) &&
     (__n = (this->alphaMode)._M_string_length, __n == (other->alphaMode)._M_string_length)) {
    if ((__n != 0) &&
       (iVar3 = bcmp((this->alphaMode)._M_dataplus._M_p,(other->alphaMode)._M_dataplus._M_p,__n),
       iVar3 != 0)) {
      return false;
    }
    if (((((ABS(other->alphaCutoff - this->alphaCutoff) < 1e-12) &&
          (this->doubleSided == other->doubleSided)) &&
         ((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
          (other->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count)) &&
        (((bVar1 = std::__equal<false>::
                   equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>>
                             ((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left,(_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>
                                       )&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
                              (other->extensions)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left), bVar1 &&
          (bVar1 = Equals(&this->extras,&other->extras), bVar1)) &&
         (((this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
           (other->values)._M_t._M_impl.super__Rb_tree_header._M_node_count &&
          ((bVar1 = std::__equal<false>::
                    equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Parameter>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Parameter>>>
                              ((this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                               (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>
                                )&(this->values)._M_t._M_impl.super__Rb_tree_header,
                               (other->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
           , bVar1 &&
           ((this->additionalValues)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
            (other->additionalValues)._M_t._M_impl.super__Rb_tree_header._M_node_count)))))))) &&
       (bVar1 = std::__equal<false>::
                equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Parameter>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Parameter>>>
                          ((this->additionalValues)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left,(_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>
                                    )&(this->additionalValues)._M_t._M_impl.super__Rb_tree_header,
                           (other->additionalValues)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left), bVar1)) {
      _Var2 = std::operator==(&this->name,&other->name);
      return _Var2;
    }
  }
  return false;
}

Assistant:

bool Material::operator==(const Material &other) const {
  return (this->pbrMetallicRoughness == other.pbrMetallicRoughness) &&
         (this->normalTexture == other.normalTexture) &&
         (this->occlusionTexture == other.occlusionTexture) &&
         (this->emissiveTexture == other.emissiveTexture) &&
         Equals(this->emissiveFactor, other.emissiveFactor) &&
         (this->alphaMode == other.alphaMode) &&
         TINYGLTF_DOUBLE_EQUAL(this->alphaCutoff, other.alphaCutoff) &&
         (this->doubleSided == other.doubleSided) &&
         (this->extensions == other.extensions) &&
         (this->extras == other.extras) && (this->values == other.values) &&
         (this->additionalValues == other.additionalValues) &&
         (this->name == other.name);
}